

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O0

void __thiscall
icu_63::TailoredSet::compareContractions(TailoredSet *this,UChar32 c,UChar *p,UChar *q)

{
  UBool UVar1;
  int8_t iVar2;
  uint32_t ce32;
  uint32_t baseCE32;
  undefined1 local_188 [4];
  int32_t cmp;
  UnicodeString none;
  UnicodeString *bs;
  UnicodeString *ts;
  undefined1 local_130 [8];
  Iterator baseSuffixes;
  ConstChar16Ptr local_a8;
  undefined1 local_a0 [8];
  Iterator suffixes;
  UChar *q_local;
  UChar *p_local;
  UChar32 c_local;
  TailoredSet *this_local;
  
  suffixes.stack_ = (UVector32 *)q;
  ConstChar16Ptr::ConstChar16Ptr(&local_a8,p);
  UCharsTrie::Iterator::Iterator((Iterator *)local_a0,&local_a8,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&ts,(char16_t *)suffixes.stack_);
  UCharsTrie::Iterator::Iterator((Iterator *)local_130,(ConstChar16Ptr *)&ts,0,&this->errorCode);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&ts);
  bs = (UnicodeString *)0x0;
  none.fUnion._48_8_ = 0;
  UnicodeString::UnicodeString((UnicodeString *)local_188,L'\xffff');
  UnicodeString::append((UnicodeString *)local_188,L'\xffff');
  while( true ) {
    if (bs == (UnicodeString *)0x0) {
      UVar1 = UCharsTrie::Iterator::next((Iterator *)local_a0,&this->errorCode);
      if (UVar1 == '\0') {
        bs = (UnicodeString *)local_188;
      }
      else {
        bs = UCharsTrie::Iterator::getString((Iterator *)local_a0);
      }
    }
    if (none.fUnion._48_8_ == 0) {
      UVar1 = UCharsTrie::Iterator::next((Iterator *)local_130,&this->errorCode);
      if (UVar1 == '\0') {
        none.fUnion._48_8_ = local_188;
      }
      else {
        none.fUnion._48_8_ = UCharsTrie::Iterator::getString((Iterator *)local_130);
      }
    }
    if ((bs == (UnicodeString *)local_188) && ((undefined1 *)none.fUnion._48_8_ == local_188))
    break;
    iVar2 = UnicodeString::compare(bs,(UnicodeString *)none.fUnion._48_8_);
    if (iVar2 < '\0') {
      addSuffix(this,c,bs);
      bs = (UnicodeString *)0x0;
    }
    else {
      if (iVar2 < '\x01') {
        this->suffix = bs;
        ce32 = UCharsTrie::Iterator::getValue((Iterator *)local_a0);
        baseCE32 = UCharsTrie::Iterator::getValue((Iterator *)local_130);
        compare(this,c,ce32,baseCE32);
        this->suffix = (UnicodeString *)0x0;
        bs = (UnicodeString *)0x0;
      }
      else {
        addSuffix(this,c,(UnicodeString *)none.fUnion._48_8_);
      }
      none.fUnion._48_8_ = 0;
    }
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_188);
  UCharsTrie::Iterator::~Iterator((Iterator *)local_130);
  UCharsTrie::Iterator::~Iterator((Iterator *)local_a0);
  return;
}

Assistant:

void
TailoredSet::compareContractions(UChar32 c, const UChar *p, const UChar *q) {
    // Parallel iteration over suffixes of both tables.
    UCharsTrie::Iterator suffixes(p, 0, errorCode);
    UCharsTrie::Iterator baseSuffixes(q, 0, errorCode);
    const UnicodeString *ts = NULL;  // Tailoring suffix.
    const UnicodeString *bs = NULL;  // Base suffix.
    // Use a string with two U+FFFF as the limit sentinel.
    // U+FFFF is untailorable and will not occur in contractions except maybe
    // as a single suffix character for a root-collator boundary contraction.
    UnicodeString none((UChar)0xffff);
    none.append((UChar)0xffff);
    for(;;) {
        if(ts == NULL) {
            if(suffixes.next(errorCode)) {
                ts = &suffixes.getString();
            } else {
                ts = &none;
            }
        }
        if(bs == NULL) {
            if(baseSuffixes.next(errorCode)) {
                bs = &baseSuffixes.getString();
            } else {
                bs = &none;
            }
        }
        if(ts == &none && bs == &none) { break; }
        int32_t cmp = ts->compare(*bs);
        if(cmp < 0) {
            // ts occurs in the tailoring but not in the base.
            addSuffix(c, *ts);
            ts = NULL;
        } else if(cmp > 0) {
            // bs occurs in the base but not in the tailoring.
            addSuffix(c, *bs);
            bs = NULL;
        } else {
            suffix = ts;
            compare(c, (uint32_t)suffixes.getValue(), (uint32_t)baseSuffixes.getValue());
            suffix = NULL;
            ts = NULL;
            bs = NULL;
        }
    }
}